

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.h
# Opt level: O0

void __thiscall runner::runner(runner *this,service *srv)

{
  undefined8 in_RSI;
  undefined8 *in_RDI;
  allocator local_61;
  string local_60 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffb0;
  value *in_stack_ffffffffffffffb8;
  string local_30 [48];
  
  *in_RDI = in_RSI;
  std::__cxx11::string::string((string *)(in_RDI + 1));
  cppcms::service::settings();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"none",&local_61);
  cppcms::json::value::get<std::__cxx11::string>
            (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  std::__cxx11::string::operator=((string *)(in_RDI + 1),local_30);
  std::__cxx11::string::~string(local_30);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  return;
}

Assistant:

runner(cppcms::service &srv) : srv_(&srv)
	{
		command_ = srv.settings().get<std::string>("test.exec","none");
	}